

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

Set * raviX_set_create(_func_uint32_t_void_ptr *hash_function,
                      _func_int_void_ptr_void_ptr *key_equals_function)

{
  void *pvVar1;
  Set *set;
  _func_int_void_ptr_void_ptr *key_equals_function_local;
  _func_uint32_t_void_ptr *hash_function_local;
  
  hash_function_local = (_func_uint32_t_void_ptr *)raviX_malloc(0x30);
  *(undefined4 *)(hash_function_local + 0x24) = 0;
  *(uint32_t *)(hash_function_local + 0x18) = hash_sizes[*(uint *)(hash_function_local + 0x24)].size
  ;
  *(uint32_t *)(hash_function_local + 0x1c) =
       hash_sizes[*(uint *)(hash_function_local + 0x24)].rehash;
  *(uint32_t *)(hash_function_local + 0x20) =
       hash_sizes[*(uint *)(hash_function_local + 0x24)].max_entries;
  *(_func_uint32_t_void_ptr **)(hash_function_local + 8) = hash_function;
  *(_func_int_void_ptr_void_ptr **)(hash_function_local + 0x10) = key_equals_function;
  pvVar1 = raviX_calloc((ulong)*(uint *)(hash_function_local + 0x18),0x10);
  *(void **)hash_function_local = pvVar1;
  *(undefined4 *)(hash_function_local + 0x28) = 0;
  *(undefined4 *)(hash_function_local + 0x2c) = 0;
  if (*(long *)hash_function_local == 0) {
    raviX_free(hash_function_local);
    hash_function_local = (_func_uint32_t_void_ptr *)0x0;
  }
  return (Set *)hash_function_local;
}

Assistant:

Set *raviX_set_create(uint32_t (*hash_function)(const void *key),
	   int (*key_equals_function)(const void *a,
				   const void *b))
{
	Set *set;

	set = (Set *) raviX_malloc(sizeof(*set));

	set->size_index = 0;
	set->size = hash_sizes[set->size_index].size;
	set->rehash = hash_sizes[set->size_index].rehash;
	set->max_entries = hash_sizes[set->size_index].max_entries;
	set->hash_function = hash_function;
	set->key_equals_function = key_equals_function;
	set->table = (SetEntry *) raviX_calloc(set->size, sizeof(*set->table));
	set->entries = 0;
	set->deleted_entries = 0;

	if (set->table == NULL) {
		raviX_free(set);
		return NULL;
	}

	return set;
}